

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackPropertiesGenerator.cxx
# Opt level: O3

void __thiscall
cmCPackPropertiesGenerator::GenerateScriptForConfig
          (cmCPackPropertiesGenerator *this,ostream *os,string *config,Indent *indent)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmCompiledGeneratorExpression *this_00;
  char *pcVar2;
  _Rb_tree_header *p_Var3;
  ostream *poVar4;
  _Rb_tree_node_base *p_Var5;
  int iVar6;
  _Base_ptr p_Var7;
  allocator local_b1;
  string local_b0;
  string value;
  string local_50;
  
  this_00 = cmInstalledFile::GetNameExpression(this->InstalledFile);
  value._M_dataplus._M_p = (pointer)&value.field_2;
  value._M_string_length = 0;
  value.field_2._M_local_buf[0] = '\0';
  pcVar2 = cmCompiledGeneratorExpression::Evaluate
                     (this_00,this->Makefile,config,false,(cmTarget *)0x0,(cmTarget *)0x0,
                      (cmGeneratorExpressionDAGChecker *)0x0,&value);
  std::__cxx11::string::string((string *)&local_50,pcVar2,(allocator *)&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)value._M_dataplus._M_p != &value.field_2) {
    operator_delete(value._M_dataplus._M_p,
                    CONCAT71(value.field_2._M_allocated_capacity._1_7_,value.field_2._M_local_buf[0]
                            ) + 1);
  }
  p_Var5 = (this->InstalledFile->Properties)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(this->InstalledFile->Properties)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var5 != p_Var3) {
    paVar1 = &local_b0.field_2;
    do {
      if (0 < indent->Level) {
        iVar6 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
          iVar6 = iVar6 + 1;
        } while (iVar6 < indent->Level);
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,"set_property(INSTALL ",0x15);
      cmOutputConverter::EscapeForCMake(&value,&local_50);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,value._M_dataplus._M_p,value._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," PROPERTY ",10);
      cmOutputConverter::EscapeForCMake(&local_b0,(string *)(p_Var5 + 1));
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,local_b0._M_dataplus._M_p,local_b0._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != paVar1) {
        operator_delete(local_b0._M_dataplus._M_p,
                        CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                                 local_b0.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)value._M_dataplus._M_p != &value.field_2) {
        operator_delete(value._M_dataplus._M_p,
                        CONCAT71(value.field_2._M_allocated_capacity._1_7_,
                                 value.field_2._M_local_buf[0]) + 1);
      }
      for (p_Var7 = *(_Base_ptr *)(p_Var5 + 2); p_Var7 != p_Var5[2]._M_parent;
          p_Var7 = (_Base_ptr)&p_Var7->_M_parent) {
        local_b0._M_string_length = 0;
        local_b0.field_2._M_local_buf[0] = '\0';
        local_b0._M_dataplus._M_p = (pointer)paVar1;
        pcVar2 = cmCompiledGeneratorExpression::Evaluate
                           (*(cmCompiledGeneratorExpression **)p_Var7,this->Makefile,config,false,
                            (cmTarget *)0x0,(cmTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,
                            &local_b0);
        std::__cxx11::string::string((string *)&value,pcVar2,&local_b1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != paVar1) {
          operator_delete(local_b0._M_dataplus._M_p,
                          CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                                   local_b0.field_2._M_local_buf[0]) + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        cmOutputConverter::EscapeForCMake(&local_b0,&value);
        std::__ostream_insert<char,std::char_traits<char>>
                  (os,local_b0._M_dataplus._M_p,local_b0._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != paVar1) {
          operator_delete(local_b0._M_dataplus._M_p,
                          CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                                   local_b0.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)value._M_dataplus._M_p != &value.field_2) {
          operator_delete(value._M_dataplus._M_p,
                          CONCAT71(value.field_2._M_allocated_capacity._1_7_,
                                   value.field_2._M_local_buf[0]) + 1);
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,")\n",2);
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != p_Var3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmCPackPropertiesGenerator::GenerateScriptForConfig(std::ostream& os,
  const std::string& config, Indent const& indent)
{
  std::string const& expandedFileName =
      this->InstalledFile.GetNameExpression().Evaluate(this->Makefile, config);

  cmInstalledFile::PropertyMapType const& properties =
    this->InstalledFile.GetProperties();

  for(cmInstalledFile::PropertyMapType::const_iterator i = properties.begin();
    i != properties.end(); ++i)
    {
    std::string const& name = i->first;
    cmInstalledFile::Property const& property = i->second;

    os << indent << "set_property(INSTALL " <<
      cmOutputConverter::EscapeForCMake(expandedFileName) << " PROPERTY " <<
      cmOutputConverter::EscapeForCMake(name);

    for(cmInstalledFile::ExpressionVectorType::const_iterator
      j = property.ValueExpressions.begin();
      j != property.ValueExpressions.end(); ++j)
      {
      std::string value = (*j)->Evaluate(this->Makefile, config);
      os << " " << cmOutputConverter::EscapeForCMake(value);
      }

    os << ")\n";
    }
}